

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O1

CURLcode ftp_pl_insert_finfo(Curl_easy *data,fileinfo *infop)

{
  WildcardData *pWVar1;
  ftp_wc *pfVar2;
  ftp_parselist_data *pfVar3;
  size_t sVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  code *pcVar8;
  
  pWVar1 = data->wildcard;
  pfVar2 = pWVar1->ftpwc;
  pfVar3 = pfVar2->parser;
  pcVar6 = Curl_dyn_ptr(&infop->buf);
  (infop->info).filename = pcVar6 + (pfVar3->offsets).filename;
  sVar4 = (pfVar3->offsets).group;
  pcVar7 = pcVar6 + sVar4;
  if (sVar4 == 0) {
    pcVar7 = (char *)0x0;
  }
  (infop->info).strings.group = pcVar7;
  sVar4 = (pfVar3->offsets).perm;
  pcVar7 = pcVar6 + sVar4;
  if (sVar4 == 0) {
    pcVar7 = (char *)0x0;
  }
  (infop->info).strings.perm = pcVar7;
  sVar4 = (pfVar3->offsets).symlink_target;
  pcVar7 = pcVar6 + sVar4;
  if (sVar4 == 0) {
    pcVar7 = (char *)0x0;
  }
  (infop->info).strings.target = pcVar7;
  (infop->info).strings.time = pcVar6 + (pfVar3->offsets).time;
  sVar4 = (pfVar3->offsets).user;
  pcVar6 = pcVar6 + sVar4;
  if (sVar4 == 0) {
    pcVar6 = (char *)0x0;
  }
  (infop->info).strings.user = pcVar6;
  pcVar8 = (data->set).fnmatch;
  if (pcVar8 == (curl_fnmatch_callback)0x0) {
    pcVar8 = Curl_fnmatch;
  }
  Curl_set_in_callback(data,true);
  iVar5 = (*pcVar8)((data->set).fnmatch_data,pWVar1->pattern,(infop->info).filename);
  if (iVar5 == 0) {
    if (((infop->info).filetype == CURLFILETYPE_SYMLINK) &&
       (pcVar7 = (infop->info).strings.target, pcVar7 != (char *)0x0)) {
      pcVar7 = strstr(pcVar7," -> ");
      Curl_set_in_callback(data,false);
      if (pcVar7 != (char *)0x0) goto LAB_0012f129;
    }
    else {
      Curl_set_in_callback(data,false);
    }
    Curl_llist_append(&pWVar1->filelist,infop,&infop->list);
  }
  else {
    Curl_set_in_callback(data,false);
LAB_0012f129:
    Curl_fileinfo_cleanup(infop);
  }
  pfVar3 = pfVar2->parser;
  pfVar3->file_data = (fileinfo *)0x0;
  return (CURLcode)pfVar3;
}

Assistant:

static CURLcode ftp_pl_insert_finfo(struct Curl_easy *data,
                                    struct fileinfo *infop)
{
  curl_fnmatch_callback compare;
  struct WildcardData *wc = data->wildcard;
  struct ftp_wc *ftpwc = wc->ftpwc;
  struct Curl_llist *llist = &wc->filelist;
  struct ftp_parselist_data *parser = ftpwc->parser;
  bool add = TRUE;
  struct curl_fileinfo *finfo = &infop->info;

  /* set the finfo pointers */
  char *str = Curl_dyn_ptr(&infop->buf);
  finfo->filename       = str + parser->offsets.filename;
  finfo->strings.group  = parser->offsets.group ?
                          str + parser->offsets.group : NULL;
  finfo->strings.perm   = parser->offsets.perm ?
                          str + parser->offsets.perm : NULL;
  finfo->strings.target = parser->offsets.symlink_target ?
                          str + parser->offsets.symlink_target : NULL;
  finfo->strings.time   = str + parser->offsets.time;
  finfo->strings.user   = parser->offsets.user ?
                          str + parser->offsets.user : NULL;

  /* get correct fnmatch callback */
  compare = data->set.fnmatch;
  if(!compare)
    compare = Curl_fnmatch;

  /* filter pattern-corresponding filenames */
  Curl_set_in_callback(data, TRUE);
  if(compare(data->set.fnmatch_data, wc->pattern,
             finfo->filename) == 0) {
    /* discard symlink which is containing multiple " -> " */
    if((finfo->filetype == CURLFILETYPE_SYMLINK) && finfo->strings.target &&
       (strstr(finfo->strings.target, " -> "))) {
      add = FALSE;
    }
  }
  else {
    add = FALSE;
  }
  Curl_set_in_callback(data, FALSE);

  if(add) {
    Curl_llist_append(llist, finfo, &infop->list);
  }
  else {
    Curl_fileinfo_cleanup(infop);
  }

  ftpwc->parser->file_data = NULL;
  return CURLE_OK;
}